

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O0

void poly1305_auth(uchar *out,uchar *m,size_t inlen,uchar *key)

{
  uint64_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined4 local_f8;
  undefined4 local_f4;
  uchar mp [16];
  uint64_t c;
  uint32_t g4;
  uint32_t g3;
  uint32_t g2;
  uint32_t g1;
  uint32_t g0;
  uint64_t f3;
  uint64_t f2;
  uint64_t f1;
  uint64_t f0;
  uint64_t t [5];
  size_t j;
  uint32_t nb;
  uint32_t b;
  uint32_t s4;
  uint32_t s3;
  uint32_t s2;
  uint32_t s1;
  uint32_t r4;
  uint32_t r3;
  uint32_t r2;
  uint32_t r1;
  uint32_t r0;
  uint32_t h4;
  uint32_t h3;
  uint32_t h2;
  uint32_t h1;
  uint32_t h0;
  uint32_t t3;
  uint32_t t2;
  uint32_t t1;
  uint32_t t0;
  uchar *key_local;
  size_t inlen_local;
  uchar *m_local;
  uchar *out_local;
  
  uVar2 = *(uint *)key & 0x3ffffff;
  uVar3 = (*(uint *)(key + 4) << 6 | *(uint *)key >> 0x1a) & 0x3ffff03;
  uVar4 = (*(uint *)(key + 8) << 0xc | *(uint *)(key + 4) >> 0x14) & 0x3ffc0ff;
  uVar5 = (*(uint *)(key + 0xc) << 0x12 | *(uint *)(key + 8) >> 0xe) & 0x3f03fff;
  uVar6 = *(uint *)(key + 0xc) >> 8 & 0xfffff;
  uVar7 = uVar5 * 5;
  uVar8 = uVar6 * 5;
  h2 = 0;
  h3 = 0;
  h4 = 0;
  r0 = 0;
  r1 = 0;
  key_local = (uchar *)inlen;
  inlen_local = (size_t)m;
  if (inlen < 0x10) goto LAB_0012d9bd;
  do {
    key_local = key_local + -0x10;
    h2 = (*(uint *)inlen_local & 0x3ffffff) + h2;
    h3 = ((uint)(*(ulong *)inlen_local >> 0x1a) & 0x3ffffff) + h3;
    h4 = ((uint)(*(ulong *)(inlen_local + 4) >> 0x14) & 0x3ffffff) + h4;
    r0 = ((uint)(*(ulong *)(inlen_local + 8) >> 0xe) & 0x3ffffff) + r0;
    r1 = (*(uint *)(inlen_local + 0xc) >> 8 | 0x1000000) + r1;
    inlen_local = inlen_local + 0x10;
    while( true ) {
      uVar15 = (ulong)h2 * (ulong)uVar2 + (ulong)h3 * (ulong)uVar8 + (ulong)h4 * (ulong)uVar7 +
               (ulong)r0 * (ulong)(uVar4 * 5) + (ulong)r1 * (ulong)(uVar3 * 5);
      uVar17 = (ulong)h3;
      uVar18 = (ulong)h3;
      uVar19 = (ulong)h4;
      uVar20 = (ulong)h3;
      uVar21 = (ulong)h4;
      uVar22 = (ulong)r0;
      uVar14 = (uVar15 >> 0x1a) +
               (ulong)h2 * (ulong)uVar3 + (ulong)h3 * (ulong)uVar2 + (ulong)h4 * (ulong)uVar8 +
               (ulong)r0 * (ulong)uVar7 + (ulong)r1 * (ulong)(uVar4 * 5);
      h3 = (uint)uVar14 & 0x3ffffff;
      uVar14 = (uVar14 >> 0x1a & 0xffffffff) +
               (ulong)h2 * (ulong)uVar4 + uVar17 * uVar3 + (ulong)h4 * (ulong)uVar2 +
               (ulong)r0 * (ulong)uVar8 + (ulong)r1 * (ulong)uVar7;
      h4 = (uint)uVar14 & 0x3ffffff;
      uVar14 = (uVar14 >> 0x1a & 0xffffffff) +
               (ulong)h2 * (ulong)uVar5 + uVar18 * uVar4 + uVar19 * uVar3 + (ulong)r0 * (ulong)uVar2
               + (ulong)r1 * (ulong)uVar8;
      r0 = (uint)uVar14 & 0x3ffffff;
      uVar14 = (uVar14 >> 0x1a & 0xffffffff) +
               (ulong)h2 * (ulong)uVar6 + uVar20 * uVar5 + uVar21 * uVar4 + uVar22 * uVar3 +
               (ulong)r1 * (ulong)uVar2;
      r1 = (uint)uVar14 & 0x3ffffff;
      h2 = (int)(uVar14 >> 0x1a) * 5 + ((uint)uVar15 & 0x3ffffff);
      if ((uchar *)0xf < key_local) break;
LAB_0012d9bd:
      if (key_local == (uchar *)0x0) {
        uVar2 = (h2 >> 0x1a) + h3;
        uVar3 = (uVar2 >> 0x1a) + h4;
        uVar4 = uVar3 & 0x3ffffff;
        uVar3 = (uVar3 >> 0x1a) + r0;
        uVar5 = uVar3 & 0x3ffffff;
        uVar3 = (uVar3 >> 0x1a) + r1;
        uVar6 = uVar3 & 0x3ffffff;
        uVar3 = (uVar3 >> 0x1a) * 5 + (h2 & 0x3ffffff);
        uVar7 = uVar3 & 0x3ffffff;
        uVar2 = (uVar3 >> 0x1a) + (uVar2 & 0x3ffffff);
        uVar3 = uVar7 + 5;
        uVar8 = uVar2 + (uVar3 >> 0x1a);
        uVar9 = uVar4 + (uVar8 >> 0x1a);
        uVar10 = uVar5 + (uVar9 >> 0x1a);
        uVar11 = uVar6 + (uVar10 >> 0x1a) + 0xfc000000;
        uVar12 = 0xffffffff - ((int)uVar11 >> 0x1f);
        uVar13 = uVar12 ^ 0xffffffff;
        uVar8 = uVar2 & uVar13 | uVar8 & 0x3ffffff & uVar12;
        uVar9 = uVar4 & uVar13 | uVar9 & 0x3ffffff & uVar12;
        uVar5 = uVar5 & uVar13 | uVar10 & 0x3ffffff & uVar12;
        uVar15 = (ulong)(uVar7 & uVar13 | uVar3 & 0x3ffffff & uVar12 | uVar8 << 0x1a) +
                 (ulong)*(uint *)(key + 0x10);
        uVar2 = *(uint *)(key + 0x14);
        uVar3 = *(uint *)(key + 0x18);
        uVar4 = *(uint *)(key + 0x1c);
        *out = (uchar)uVar15;
        out[1] = (uchar)(uVar15 >> 8);
        out[2] = (uchar)(uVar15 >> 0x10);
        out[3] = (uchar)(uVar15 >> 0x18);
        uVar15 = (uVar15 >> 0x20) + (ulong)(uVar8 >> 6 | uVar9 << 0x14) + (ulong)uVar2;
        out[4] = (uchar)uVar15;
        out[5] = (uchar)(uVar15 >> 8);
        out[6] = (uchar)(uVar15 >> 0x10);
        out[7] = (uchar)(uVar15 >> 0x18);
        uVar15 = (uVar15 >> 0x20) + (ulong)(uVar9 >> 0xc | uVar5 << 0xe) + (ulong)uVar3;
        out[8] = (uchar)uVar15;
        out[9] = (uchar)(uVar15 >> 8);
        out[10] = (uchar)(uVar15 >> 0x10);
        out[0xb] = (uchar)(uVar15 >> 0x18);
        lVar16 = (uVar15 >> 0x20) +
                 (ulong)(uVar5 >> 0x12 | (uVar6 & uVar13 | uVar11 & uVar12) << 8) + (ulong)uVar4;
        out[0xc] = (uchar)lVar16;
        out[0xd] = (uchar)((ulong)lVar16 >> 8);
        out[0xe] = (uchar)((ulong)lVar16 >> 0x10);
        out[0xf] = (uchar)((ulong)lVar16 >> 0x18);
        return;
      }
      for (t[4] = 0; t[4] < key_local; t[4] = t[4] + 1) {
        *(undefined1 *)((long)&local_f8 + t[4]) = *(undefined1 *)(inlen_local + t[4]);
      }
      *(undefined1 *)((long)&local_f8 + t[4]) = 1;
      uVar1 = t[4];
      while (t[4] = uVar1 + 1, t[4] < 0x10) {
        *(undefined1 *)((long)&local_f8 + uVar1 + 1) = 0;
        uVar1 = t[4];
      }
      key_local = (uchar *)0x0;
      h2 = (local_f8 & 0x3ffffff) + h2;
      h3 = ((uint)(CONCAT44(local_f4,local_f8) >> 0x1a) & 0x3ffffff) + h3;
      h4 = ((uint)(CONCAT44(mp._0_4_,local_f4) >> 0x14) & 0x3ffffff) + h4;
      r0 = ((uint)(CONCAT44(mp._4_4_,mp._0_4_) >> 0xe) & 0x3ffffff) + r0;
      r1 = ((uint)mp._4_4_ >> 8) + r1;
    }
  } while( true );
}

Assistant:

void
poly1305_auth(unsigned char out[POLY1305_TAGLEN], const unsigned char *m,
              size_t inlen, const unsigned char key[POLY1305_KEYLEN]) {
    uint32_t t0;
    uint32_t t1;
    uint32_t t2;
    uint32_t t3;
    uint32_t h0;
    uint32_t h1;
    uint32_t h2;
    uint32_t h3;
    uint32_t h4;
    uint32_t r0;
    uint32_t r1;
    uint32_t r2;
    uint32_t r3;
    uint32_t r4;
    uint32_t s1;
    uint32_t s2;
    uint32_t s3;
    uint32_t s4;
    uint32_t b;
    uint32_t nb;
    size_t j;
    uint64_t t[5];
    uint64_t f0;
    uint64_t f1;
    uint64_t f2;
    uint64_t f3;
    uint32_t g0;
    uint32_t g1;
    uint32_t g2;
    uint32_t g3;
    uint32_t g4;
    uint64_t c;
    unsigned char mp[16];

    /* clamp key */
    t0 = U8TO32_LE(key + 0);
    t1 = U8TO32_LE(key + 4);
    t2 = U8TO32_LE(key + 8);
    t3 = U8TO32_LE(key + 12);

    /* precompute multipliers */
    r0 = t0 & 0x3ffffff; t0 >>= 26; t0 |= t1 << 6;
    r1 = t0 & 0x3ffff03; t1 >>= 20; t1 |= t2 << 12;
    r2 = t1 & 0x3ffc0ff; t2 >>= 14; t2 |= t3 << 18;
    r3 = t2 & 0x3f03fff; t3 >>= 8;
    r4 = t3 & 0x00fffff;

    s1 = r1 * 5;
    s2 = r2 * 5;
    s3 = r3 * 5;
    s4 = r4 * 5;

    /* init state */
    h0 = 0;
    h1 = 0;
    h2 = 0;
    h3 = 0;
    h4 = 0;

    /* full blocks */
    if(inlen < 16)
        goto poly1305_donna_atmost15bytes;

poly1305_donna_16bytes:
    m += 16;
    inlen -= 16;

    t0 = U8TO32_LE(m-16);
    t1 = U8TO32_LE(m-12);
    t2 = U8TO32_LE(m-8);
    t3 = U8TO32_LE(m-4);

    h0 += t0 & 0x3ffffff;
    h1 += ((uint32_t)((((uint64_t)t1 << 32) | t0) >> 26) & 0x3ffffff);
    h2 += ((uint32_t)((((uint64_t)t2 << 32) | t1) >> 20) & 0x3ffffff);
    h3 += ((uint32_t)((((uint64_t)t3 << 32) | t2) >> 14) & 0x3ffffff);
    h4 += (t3 >> 8) | (1 << 24);


poly1305_donna_mul:
    t[0] = mul32x32_64(h0, r0) + mul32x32_64(h1, s4) + mul32x32_64(h2, s3) +
        mul32x32_64(h3, s2) + mul32x32_64(h4, s1);
    t[1] = mul32x32_64(h0, r1) + mul32x32_64(h1, r0) + mul32x32_64(h2, s4) +
        mul32x32_64(h3, s3) + mul32x32_64(h4, s2);
    t[2] = mul32x32_64(h0, r2) + mul32x32_64(h1, r1) + mul32x32_64(h2, r0) +
        mul32x32_64(h3, s4) + mul32x32_64(h4, s3);
    t[3] = mul32x32_64(h0, r3) + mul32x32_64(h1, r2) + mul32x32_64(h2, r1) +
        mul32x32_64(h3, r0) + mul32x32_64(h4, s4);
    t[4] = mul32x32_64(h0, r4) + mul32x32_64(h1, r3) + mul32x32_64(h2, r2) +
        mul32x32_64(h3, r1) + mul32x32_64(h4, r0);

    h0 = (uint32_t)t[0] & 0x3ffffff;
    c = (t[0] >> 26);

    t[1] += c;
    h1 = (uint32_t)t[1] & 0x3ffffff;
    b = (uint32_t)(t[1] >> 26);

    t[2] += b;
    h2 = (uint32_t)t[2] & 0x3ffffff;
    b = (uint32_t)(t[2] >> 26);

    t[3] += b;
    h3 = (uint32_t)t[3] & 0x3ffffff;
    b = (uint32_t)(t[3] >> 26);

    t[4] += b;
    h4 = (uint32_t)t[4] & 0x3ffffff;
    b = (uint32_t)(t[4] >> 26);

    h0 += b * 5;

    if(inlen >= 16)
        goto poly1305_donna_16bytes;

    /* final bytes */
poly1305_donna_atmost15bytes:
    if(!inlen)
        goto poly1305_donna_finish;

    for(j = 0; j < inlen; j++) mp[j] = m[j];
    mp[j++] = 1;
    for(; j < 16; j++)
        mp[j] = 0;

    inlen = 0;

    t0 = U8TO32_LE(mp + 0);
    t1 = U8TO32_LE(mp + 4);
    t2 = U8TO32_LE(mp + 8);
    t3 = U8TO32_LE(mp + 12);

    h0 += t0 & 0x3ffffff;
    h1 += ((uint32_t)((((uint64_t)t1 << 32) | t0) >> 26) & 0x3ffffff);
    h2 += ((uint32_t)((((uint64_t)t2 << 32) | t1) >> 20) & 0x3ffffff);
    h3 += ((uint32_t)((((uint64_t)t3 << 32) | t2) >> 14) & 0x3ffffff);
    h4 += (t3 >> 8);

    goto poly1305_donna_mul;

poly1305_donna_finish:
    b = h0 >> 26; h0 = h0 & 0x3ffffff;
    h1 +=     b; b = h1 >> 26; h1 = h1 & 0x3ffffff;
    h2 +=     b; b = h2 >> 26; h2 = h2 & 0x3ffffff;
    h3 +=     b; b = h3 >> 26; h3 = h3 & 0x3ffffff;
    h4 +=     b; b = h4 >> 26; h4 = h4 & 0x3ffffff;
    h0 += b * 5; b = h0 >> 26; h0 = h0 & 0x3ffffff;
    h1 +=     b;

    g0 = h0 + 5; b = g0 >> 26; g0 &= 0x3ffffff;
    g1 = h1 + b; b = g1 >> 26; g1 &= 0x3ffffff;
    g2 = h2 + b; b = g2 >> 26; g2 &= 0x3ffffff;
    g3 = h3 + b; b = g3 >> 26; g3 &= 0x3ffffff;
    g4 = h4 + b - (1 << 26);

    b = (g4 >> 31) - 1;
    nb = ~b;
    h0 = (h0 & nb) | (g0 & b);
    h1 = (h1 & nb) | (g1 & b);
    h2 = (h2 & nb) | (g2 & b);
    h3 = (h3 & nb) | (g3 & b);
    h4 = (h4 & nb) | (g4 & b);

    f0 = ((h0      ) | (h1 << 26)) + (uint64_t)U8TO32_LE(&key[16]);
    f1 = ((h1 >>  6) | (h2 << 20)) + (uint64_t)U8TO32_LE(&key[20]);
    f2 = ((h2 >> 12) | (h3 << 14)) + (uint64_t)U8TO32_LE(&key[24]);
    f3 = ((h3 >> 18) | (h4 <<  8)) + (uint64_t)U8TO32_LE(&key[28]);

    U32TO8_LE(&out[ 0], f0); f1 += (f0 >> 32);
    U32TO8_LE(&out[ 4], f1); f2 += (f1 >> 32);
    U32TO8_LE(&out[ 8], f2); f3 += (f2 >> 32);
    U32TO8_LE(&out[12], f3);
}